

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

FieldBase * __thiscall FIX::FieldBase::operator=(FieldBase *this,FieldBase *rhs)

{
  int iVar1;
  FieldBase *rhs_local;
  FieldBase *this_local;
  
  iVar1 = getTag(rhs);
  this->m_tag = iVar1;
  std::__cxx11::string::operator=((string *)&this->m_string,(string *)&rhs->m_string);
  this->m_metrics = rhs->m_metrics;
  std::__cxx11::string::clear();
  return this;
}

Assistant:

FieldBase &operator=(const FieldBase &rhs) {
    m_tag = rhs.getTag();
    m_string = rhs.m_string;
    m_metrics = rhs.m_metrics;
    m_data.clear();

    return *this;
  }